

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_get_active_buffer_ranges
          (spvc_compiler compiler,spvc_variable_id id,spvc_buffer_range **ranges,size_t *num_ranges)

{
  ScratchMemoryAllocation *pSVar1;
  BufferRange *r;
  BufferRange *pBVar2;
  long lVar3;
  spvc_buffer_range local_218 [2];
  SmallVector<spirv_cross::BufferRange,_8UL> active_ranges;
  SmallVector<spvc_buffer_range,_8UL> translated;
  
  spirv_cross::Compiler::get_active_buffer_ranges
            (&active_ranges,
             (compiler->compiler)._M_t.
             super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
             ._M_t.
             super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
             .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,(VariableID)id);
  translated.super_VectorView<spvc_buffer_range>.ptr =
       (spvc_buffer_range *)&translated.stack_storage;
  translated.super_VectorView<spvc_buffer_range>.buffer_size = 0;
  translated.buffer_capacity = 8;
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::reserve
            (&translated,active_ranges.super_VectorView<spirv_cross::BufferRange>.buffer_size);
  pBVar2 = active_ranges.super_VectorView<spirv_cross::BufferRange>.ptr;
  for (lVar3 = active_ranges.super_VectorView<spirv_cross::BufferRange>.buffer_size * 0x18;
      lVar3 != 0; lVar3 = lVar3 + -0x18) {
    local_218[0].index = pBVar2->index;
    local_218[0].offset = pBVar2->offset;
    local_218[0].range = pBVar2->range;
    spirv_cross::SmallVector<spvc_buffer_range,_8UL>::push_back(&translated,local_218);
    pBVar2 = pBVar2 + 1;
  }
  pSVar1 = (ScratchMemoryAllocation *)operator_new(0xe0);
  memset(pSVar1 + 4,0,0xc0);
  pSVar1->_vptr_ScratchMemoryAllocation = (_func_int **)&PTR__TemporaryBuffer_0039dbc0;
  pSVar1[2]._vptr_ScratchMemoryAllocation = (_func_int **)0x0;
  pSVar1[1]._vptr_ScratchMemoryAllocation = (_func_int **)(pSVar1 + 4);
  pSVar1[3]._vptr_ScratchMemoryAllocation = (_func_int **)0x8;
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::operator=
            ((SmallVector<spvc_buffer_range,_8UL> *)(pSVar1 + 1),&translated);
  *ranges = (spvc_buffer_range *)pSVar1[1]._vptr_ScratchMemoryAllocation;
  *num_ranges = (size_t)pSVar1[2]._vptr_ScratchMemoryAllocation;
  local_218[0]._0_8_ = pSVar1;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::push_back(&compiler->context->allocations,
              (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_> *)
              local_218);
  if ((ScratchMemoryAllocation *)local_218[0]._0_8_ != (ScratchMemoryAllocation *)0x0) {
    (*(*(_func_int ***)local_218[0]._0_8_)[1])();
  }
  spirv_cross::SmallVector<spvc_buffer_range,_8UL>::~SmallVector(&translated);
  spirv_cross::SmallVector<spirv_cross::BufferRange,_8UL>::~SmallVector(&active_ranges);
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_active_buffer_ranges(spvc_compiler compiler,
                                                   spvc_variable_id id,
                                                   const spvc_buffer_range **ranges,
                                                   size_t *num_ranges)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto active_ranges = compiler->compiler->get_active_buffer_ranges(id);
		SmallVector<spvc_buffer_range> translated;
		translated.reserve(active_ranges.size());
		for (auto &r : active_ranges)
		{
			spvc_buffer_range trans = { r.index, r.offset, r.range };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_buffer_range>>();
		ptr->buffer = std::move(translated);
		*ranges = ptr->buffer.data();
		*num_ranges = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}